

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O2

void __thiscall
Fl_PostScript_Graphics_Driver::draw_image
          (Fl_PostScript_Graphics_Driver *this,Fl_Draw_Image_Cb call,void *data,int ix,int iy,int iw
          ,int ih,int D)

{
  byte bVar1;
  byte b;
  int iVar2;
  uchar *puVar3;
  void *data_00;
  byte b_00;
  int iVar4;
  byte b_01;
  int iVar5;
  uint uVar6;
  Fl_PostScript_Graphics_Driver *pFVar7;
  char *pcVar8;
  long lVar9;
  byte *pbVar10;
  int iVar11;
  uchar *puVar12;
  ulong uVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  dVar15 = (double)ix;
  dVar16 = (double)iy;
  dVar17 = (double)iw;
  uVar13 = (ulong)(uint)ih;
  dVar18 = (double)ih;
  fwrite("save\n",5,1,(FILE *)this->output);
  iVar2 = this->lang_level_;
  if (iVar2 < 2) {
    fprintf((FILE *)this->output,"%g %g %g %g %i %i CI",dVar15,dVar16 + dVar18,dVar17,-dVar18,
            (ulong)(uint)iw,(ulong)(uint)ih);
  }
  else {
    pcVar8 = "true";
    if (this->interpolate_ == 0) {
      pcVar8 = "false";
    }
    if (iVar2 == 2 || this->mask == (uchar *)0x0) {
      if (iVar2 == 2 && this->mask != (uchar *)0x0) {
        fprintf((FILE *)this->output," %g %g %g %g %d %d pixmap_plot\n",dVar15,dVar16,dVar17,
                (ulong)(uint)iw,uVar13);
        bVar14 = false;
        goto LAB_00200e03;
      }
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %s CII\n",dVar15,dVar16 + dVar18,dVar17,
              -dVar18,(ulong)(uint)iw,uVar13);
    }
    else {
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %i %i %s CIM\n",dVar15,dVar16 + dVar18,dVar17,
              -dVar18,(ulong)(uint)iw,uVar13,(ulong)(uint)this->mx,(ulong)(uint)this->my,pcVar8);
    }
  }
  bVar14 = true;
LAB_00200e03:
  pFVar7 = (Fl_PostScript_Graphics_Driver *)(long)(D * iw);
  puVar3 = (uchar *)operator_new__((ulong)pFVar7);
  puVar12 = this->mask;
  data_00 = prepare_rle85(pFVar7);
  if (bVar14) {
    iVar4 = 0;
    iVar2 = 0;
    if (0 < iw) {
      iVar2 = iw;
    }
    iVar11 = 0;
    if (0 < ih) {
      iVar11 = ih;
    }
    for (; iVar4 != iVar11; iVar4 = iVar4 + 1) {
      if ((this->mask != (uchar *)0x0) && (2 < this->lang_level_)) {
        for (iVar5 = 0; iVar5 < this->my / ih; iVar5 = iVar5 + 1) {
          for (lVar9 = 0; (int)lVar9 < (this->mx + 7) / 8; lVar9 = lVar9 + 1) {
            write_rle85(this,""[puVar12[lVar9] & 0xf] << 4 | ""[puVar12[lVar9] >> 4],data_00);
          }
          puVar12 = puVar12 + lVar9;
        }
      }
      (*call)(data,0,iVar4,iw,puVar3);
      pbVar10 = puVar3 + 3;
      iVar5 = iVar2;
      while (bVar14 = iVar5 != 0, iVar5 = iVar5 + -1, bVar14) {
        b_00 = pbVar10[-3];
        b_01 = pbVar10[-2];
        b = pbVar10[-1];
        if ((3 < D) && (this->lang_level_ < 3)) {
          bVar1 = *pbVar10;
          uVar6 = bVar1 ^ 0xff;
          b_00 = (byte)((ulong)(this->bg_r * uVar6 + (uint)b_00 * (uint)bVar1) / 0xff);
          b_01 = (byte)((ulong)(this->bg_g * uVar6 + (uint)b_01 * (uint)bVar1) / 0xff);
          b = (byte)((this->bg_b * uVar6 + (uint)b * (uint)bVar1) / 0xff);
        }
        write_rle85(this,b_00,data_00);
        write_rle85(this,b_01,data_00);
        write_rle85(this,b,data_00);
        pbVar10 = pbVar10 + D;
      }
    }
  }
  else {
    iVar4 = ih + -1;
    iVar2 = 0;
    if (0 < iw) {
      iVar2 = iw;
    }
    for (iVar11 = iVar4; -1 < iVar11; iVar11 = iVar11 + -1) {
      (*call)(data,0,iVar11,iw,puVar3);
      puVar12 = puVar3 + 2;
      iVar5 = iVar2;
      while (bVar14 = iVar5 != 0, iVar5 = iVar5 + -1, bVar14) {
        write_rle85(this,puVar12[-2],data_00);
        write_rle85(this,puVar12[-1],data_00);
        write_rle85(this,*puVar12,data_00);
        puVar12 = puVar12 + D;
      }
    }
    close_rle85(this,data_00);
    pFVar7 = (Fl_PostScript_Graphics_Driver *)&DAT_0000000a;
    fputc(10,(FILE *)this->output);
    data_00 = prepare_rle85(pFVar7);
    for (; -1 < iVar4; iVar4 = iVar4 + -1) {
      iVar2 = this->mx;
      iVar11 = this->my;
      puVar12 = this->mask + ((iVar2 + 7) / 8) * (iVar11 / ih) * iVar4;
      for (iVar5 = 0; iVar5 < iVar11 / ih; iVar5 = iVar5 + 1) {
        for (lVar9 = 0; (int)lVar9 < (iVar2 + 7) / 8; lVar9 = lVar9 + 1) {
          write_rle85(this,""[puVar12[lVar9] & 0xf] << 4 | ""[puVar12[lVar9] >> 4],data_00);
          iVar2 = this->mx;
        }
        iVar11 = this->my;
        puVar12 = puVar12 + lVar9;
      }
    }
  }
  close_rle85(this,data_00);
  fwrite("\nrestore\n",9,1,(FILE *)this->output);
  operator_delete__(puVar3);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw_image(Fl_Draw_Image_Cb call, void *data, int ix, int iy, int iw, int ih, int D) {
  double x = ix, y = iy, w = iw, h = ih;

  int level2_mask = 0;
  fprintf(output,"save\n");
  int i,j,k;
  const char * interpol;
  if (lang_level_ > 1) {
    if (interpolate_) interpol="true";
    else interpol="false";
    if (mask && lang_level_ > 2) {
      fprintf(output, "%g %g %g %g %i %i %i %i %s CIM\n", x , y+h , w , -h , iw , ih, mx, my, interpol);
    }
    else if (mask && lang_level_ == 2) {
      level2_mask = 1; // use method for drawing masked color image with PostScript level 2
      fprintf(output, " %g %g %g %g %d %d pixmap_plot\n", x, y, w, h, iw, ih);
    }
    else {
      fprintf(output, "%g %g %g %g %i %i %s CII\n", x , y+h , w , -h , iw , ih, interpol);
    }
  } else {
    fprintf(output , "%g %g %g %g %i %i CI", x , y+h , w , -h , iw , ih);
  }
  
  int LD=iw*D;
  uchar *rgbdata=new uchar[LD];
  uchar *curmask=mask;
  void *big = prepare_rle85();
  
  if (level2_mask) {
    for (j = ih - 1; j >= 0; j--) { // output full image data
      call(data, 0, j, iw, rgbdata);
      uchar *curdata = rgbdata;
      for (i=0 ; i<iw ; i++) {
        write_rle85(curdata[0], big); write_rle85(curdata[1], big); write_rle85(curdata[2], big);
        curdata += D;
      }
    }
    close_rle85(big); fputc('\n', output);
    big = prepare_rle85();
    for (j = ih - 1; j >= 0; j--) { // output mask data
      curmask = mask + j * (my/ih) * ((mx+7)/8);
      for (k=0; k < my/ih; k++) {
        for (i=0; i < ((mx+7)/8); i++) {
          write_rle85(swap_byte(*curmask), big);
          curmask++;
        }
      }
    }
  }
  else {
    for (j=0; j<ih;j++) {
      if (mask && lang_level_ > 2) {  // InterleaveType 2 mask data
        for (k=0; k<my/ih;k++) { //for alpha pseudo-masking
          for (i=0; i<((mx+7)/8);i++) {
            write_rle85(swap_byte(*curmask), big);
            curmask++;
          }
        }
      }
      call(data,0,j,iw,rgbdata);
      uchar *curdata=rgbdata;
      for (i=0 ; i<iw ; i++) {
        uchar r = curdata[0];
        uchar g =  curdata[1];
        uchar b =  curdata[2];
        
        if (lang_level_<3 && D>3) { //can do  mixing using bg_* colors)
          unsigned int a2 = curdata[3]; //must be int
          unsigned int a = 255-a2;
          r = (a2 * r + bg_r * a)/255;
          g = (a2 * g + bg_g * a)/255;
          b = (a2 * b + bg_b * a)/255;
        }
        
        write_rle85(r, big); write_rle85(g, big); write_rle85(b, big);
        curdata +=D;
      }
      
    }
  }
  close_rle85(big);
  fprintf(output,"\nrestore\n");
  delete[] rgbdata;
}